

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O1

REF_STATUS ref_export_smesh(REF_GRID ref_grid,char *filename)

{
  REF_NODE ref_node;
  REF_DBL *pRVar1;
  REF_CELL ref_cell;
  uint uVar2;
  REF_STATUS RVar3;
  FILE *__stream;
  long lVar4;
  ulong uVar5;
  int cell;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_INT nodes [27];
  REF_INT *local_b8;
  REF_INT *local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  undefined4 local_9c;
  
  ref_node = ref_grid->node;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",0x465,
           "ref_export_smesh","unable to open file");
    uVar2 = 2;
  }
  else {
    fprintf(__stream,"%d  %d  %d  %d\n",(ulong)(uint)ref_node->n,3,0,0);
    uVar2 = ref_node_compact(ref_node,&local_b0,&local_b8);
    if (uVar2 == 0) {
      if (0 < ref_node->n) {
        uVar5 = 0;
        do {
          pRVar1 = ref_node->real;
          lVar4 = (long)local_b8[uVar5];
          fprintf(__stream,"%d  %.16e  %.16e  %.16e\n",pRVar1[lVar4 * 0xf],pRVar1[lVar4 * 0xf + 1],
                  pRVar1[lVar4 * 0xf + 2],uVar5 & 0xffffffff);
          uVar5 = uVar5 + 1;
        } while ((long)uVar5 < (long)ref_node->n);
      }
      ref_cell = ref_grid->cell[3];
      uVar2 = ref_cell->node_per;
      fprintf(__stream,"%d  %d\n",(ulong)(uint)ref_cell->n,1);
      if (0 < ref_cell->max) {
        cell = 0;
        do {
          RVar3 = ref_cell_nodes(ref_cell,cell,&local_a8);
          if (RVar3 == 0) {
            fprintf(__stream,"%d  %d %d %d  %d\n",(ulong)uVar2,(ulong)(uint)local_b0[local_a8],
                    (ulong)(uint)local_b0[local_a4],(ulong)(uint)local_b0[local_a0],local_9c);
          }
          cell = cell + 1;
        } while (cell < ref_cell->max);
      }
      fwrite("0\n0\n",4,1,__stream);
      if (local_b8 != (REF_INT *)0x0) {
        free(local_b8);
      }
      if (local_b0 != (REF_INT *)0x0) {
        free(local_b0);
      }
      fclose(__stream);
      uVar2 = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x46f,"ref_export_smesh",(ulong)uVar2,"compact");
    }
  }
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_export_smesh(REF_GRID ref_grid,
                                           const char *filename) {
  FILE *file;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nnode, ntri;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node_per, cell;
  REF_INT dim, attr, mark;
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  nnode = ref_node_n(ref_node);

  dim = 3;
  attr = 0;
  mark = 0;

  fprintf(file, "%d  %d  %d  %d\n", nnode, dim, attr, mark);

  RSS(ref_node_compact(ref_node, &o2n, &n2o), "compact");

  for (node = 0; node < ref_node_n(ref_node); node++)
    fprintf(file, "%d  %.16e  %.16e  %.16e\n", node,
            ref_node_xyz(ref_node, 0, n2o[node]),
            ref_node_xyz(ref_node, 1, n2o[node]),
            ref_node_xyz(ref_node, 2, n2o[node]));

  ref_cell = ref_grid_tri(ref_grid);
  node_per = ref_cell_node_per(ref_cell);
  ntri = ref_cell_n(ref_cell);

  mark = 1;
  fprintf(file, "%d  %d\n", ntri, mark);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    fprintf(file, "%d  %d %d %d  %d\n", node_per, o2n[nodes[0]], o2n[nodes[1]],
            o2n[nodes[2]], nodes[3]);
  }

  fprintf(file, "0\n0\n");

  ref_free(n2o);
  ref_free(o2n);

  fclose(file);

  return REF_SUCCESS;
}